

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

int __thiscall
ADPlanner::replan(ADPlanner *this,double allocated_time_secs,
                 vector<int,_std::allocator<int>_> *solution_stateIDs_V,int *psolcost)

{
  byte bVar1;
  undefined4 *in_RDX;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  bool bOptimalSolution;
  bool bFound;
  int PathCost;
  vector<int,_std::allocator<int>_> pathIds;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_3c;
  undefined1 local_38 [24];
  undefined4 *local_20;
  undefined8 local_10;
  
  local_20 = in_RDX;
  local_10 = in_XMM0_Qa;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x194e72);
  local_3c = 0;
  *local_20 = 0;
  bVar1 = (**(code **)(*in_RDI + 0x1a8))
                    (local_10,in_RDI,in_RDI[0xf],local_38,&local_3c,
                     *(byte *)((long)in_RDI + 0x71) & 1,0);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb0);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)
             pathIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,
             (vector<int,_std::allocator<int>_> *)
             pathIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  *local_20 = local_3c;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_ffffffffffffffb4,uVar2));
  return (uint)(bVar1 & 1);
}

Assistant:

int ADPlanner::replan(double allocated_time_secs, vector<int>* solution_stateIDs_V, int* psolcost)
{
    vector<int> pathIds;
    int PathCost = 0;
    bool bFound = false;
    *psolcost = 0;
    bool bOptimalSolution = false;

    SBPL_PRINTF("planner: replan called (bFirstSol=%d, bOptSol=%d)\n", bsearchuntilfirstsolution, bOptimalSolution);

    //plan for the first solution only
    bFound = Search(pSearchStateSpace_, pathIds, PathCost, bsearchuntilfirstsolution, bOptimalSolution, allocated_time_secs);
    if (!bFound) {
        SBPL_PRINTF("failed to find a solution\n");
    }

    //copy the solution
    *solution_stateIDs_V = pathIds;
    *psolcost = PathCost;

    return (int)bFound;
}